

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O2

void __thiscall wasm::Vacuum::visitTryTable(Vacuum *this,TryTable *curr)

{
  EffectAnalyzer local_190;
  
  EffectAnalyzer::EffectAnalyzer
            (&local_190,
             &((this->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_Pass.runner)->options,
             (this->
             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
             ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
             super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
             super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule,curr->body);
  EffectAnalyzer::~EffectAnalyzer(&local_190);
  if ((local_190.throws_ == false) &&
     (local_190.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               curr->body);
  }
  return;
}

Assistant:

void visitTryTable(TryTable* curr) {
    // If try_table's body does not throw, the whole try_table can be replaced
    // with the try_table's body.
    if (!EffectAnalyzer(getPassOptions(), *getModule(), curr->body).throws()) {
      replaceCurrent(curr->body);
      return;
    }
  }